

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::IssueMessage(cmake *this,MessageType t,string *text,cmListFileBacktrace *bt,bool force)

{
  pointer pcVar1;
  bool bVar2;
  MessageType t_00;
  cmake *this_00;
  undefined3 in_register_00000081;
  cmListFileBacktrace backtrace;
  ostringstream msg;
  cmListFileBacktrace local_1e8;
  undefined1 local_1a8 [376];
  
  local_1e8.Context.Name._M_dataplus._M_p = (pointer)&local_1e8.Context.Name.field_2;
  pcVar1 = (bt->Context).Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + (bt->Context).Name._M_string_length);
  local_1e8.Context.Line = (bt->Context).Line;
  local_1e8.Snapshot.State = (bt->Snapshot).State;
  local_1e8.Snapshot.Position.Tree = (bt->Snapshot).Position.Tree;
  local_1e8.Snapshot.Position.Position = (bt->Snapshot).Position.Position;
  t_00 = t;
  if (((CONCAT31(in_register_00000081,force) != 0) || (t_00 = ConvertMessageType(this,t), t_00 != t)
      ) || (bVar2 = IsMessageTypeVisible(this,t), t_00 = t, bVar2)) {
    this_00 = (cmake *)local_1a8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    PrintMessagePreamble(this_00,t_00,(ostream *)local_1a8);
    cmListFileBacktrace::PrintTitle(&local_1e8,(ostream *)local_1a8);
    printMessageText((ostream *)local_1a8,text);
    cmListFileBacktrace::PrintCallStack(&local_1e8,(ostream *)local_1a8);
    displayMessage(t_00,(ostringstream *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  cmListFileBacktrace::~cmListFileBacktrace(&local_1e8);
  return;
}

Assistant:

void cmake::IssueMessage(cmake::MessageType t, std::string const& text,
                         cmListFileBacktrace const& bt,
                         bool force)
{
  cmListFileBacktrace backtrace = bt;

  if (!force)
    {
    // override the message type, if needed, for warnings and errors
    cmake::MessageType override = this->ConvertMessageType(t);
    if (override != t)
      {
      t = override;
      force = true;
      }
    }

  if (!force && !this->IsMessageTypeVisible(t))
    {
    return;
    }

  std::ostringstream msg;
  if (!this->PrintMessagePreamble(t, msg))
    {
    return;
    }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}